

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall CTcTokenizer::look_up_keyword(CTcTokenizer *this,CTcToken *tok,tc_toktyp_t *kwtok)

{
  CVmHashEntry *pCVar1;
  
  pCVar1 = CVmHashTable::find(this->kw_,tok->text_,tok->text_len_);
  if (pCVar1 != (CVmHashEntry *)0x0) {
    *kwtok = *(tc_toktyp_t *)&pCVar1->field_0x24;
  }
  return (uint)(pCVar1 != (CVmHashEntry *)0x0);
}

Assistant:

int CTcTokenizer::look_up_keyword(const CTcToken *tok, tc_toktyp_t *kwtok)
{
    CTcHashEntryKw *kw;

    /* look it up in the keyword table */
    kw = (CTcHashEntryKw *)kw_->find(tok->get_text(), tok->get_text_len());
    if (kw != 0)
    {
        /* we found the keyword - set 'kw' to the keyword token id */
        *kwtok = kw->get_tok_id();

        /* tell the caller we found it */
        return TRUE;
    }
    else
    {
        /* tell the caller it's not a keyword */
        return FALSE;
    }
}